

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initResourceFiles(VcprojGenerator *this)

{
  VCFilter *this_00;
  QMakeProject *pQVar1;
  ProStringList *pPVar2;
  long lVar3;
  QString *qrc_file;
  QString *inpf;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<QString> local_c8;
  QArrayDataPointer<QString> local_a8;
  ProString local_88;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).ResourceFiles;
  QString::operator=(&this_00->Name,"Resource Files");
  (this->vcProject).ResourceFiles.ParseFiles = _False;
  QString::operator=(&(this->vcProject).ResourceFiles.Filter,"qrc;*");
  QString::operator=(&(this->vcProject).ResourceFiles.Guid,"{D9D6E242-F8AF-46E4-B9FD-80ECBC20BA3E}")
  ;
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"rcc.depend_command");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  ProStringList::join((QString *)&local_58,pPVar2,(QChar)0x20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (local_58.size != 0) {
    local_a8.size = -0x5555555555555556;
    local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_88,"RESOURCES");
    pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
    ProStringList::toQStringList((QStringList *)&local_a8,pPVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    local_c8.size = 0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QString *)0x0;
    inpf = local_a8.ptr;
    for (lVar3 = local_a8.size * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
      ProString::ProString(&local_88,"rcc");
      local_e8.d = (Data *)0x0;
      local_e8.ptr = (char16_t *)0x0;
      local_e8.size = 0;
      MakefileGenerator::callExtraCompilerDependCommand
                ((MakefileGenerator *)this,&local_88,(QString *)&local_58,inpf,(QString *)&local_e8,
                 true,(QStringList *)&local_c8,false,true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      inpf = inpf + 1;
    }
    VCFilter::addFiles(this_00,(QStringList *)&local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"RESOURCES");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  VCFilter::addFiles(this_00,pPVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  (this->vcProject).ResourceFiles.Project = this;
  (this->vcProject).ResourceFiles.Config = &(this->vcProject).Configuration;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initResourceFiles()
{
    vcProject.ResourceFiles.Name = "Resource Files";
    vcProject.ResourceFiles.ParseFiles = _False;
    vcProject.ResourceFiles.Filter = "qrc;*"; //"rc;ico;cur;bmp;dlg;rc2;rct;bin;rgs;gif;jpg;jpeg;jpe;resx;ts;xlf;qrc";
    vcProject.ResourceFiles.Guid = _GUIDResourceFiles;

    // Bad hack, please look away -------------------------------------
    QString rcc_dep_cmd = project->values("rcc.depend_command").join(' ');
    if(!rcc_dep_cmd.isEmpty()) {
        const QStringList qrc_files = project->values("RESOURCES").toQStringList();
        QStringList deps;
        for (const QString &qrc_file : qrc_files) {
            callExtraCompilerDependCommand("rcc",
                                           rcc_dep_cmd,
                                           qrc_file,
                                           QString(),
                                           true,  // dep_lines
                                           &deps,
                                           false, // existingDepsOnly
                                           true   // checkCommandavailability
                                          );
        }
        vcProject.ResourceFiles.addFiles(deps);
    }
    // You may look again --------------------------------------------

    vcProject.ResourceFiles.addFiles(project->values("RESOURCES"));

    vcProject.ResourceFiles.Project = this;
    vcProject.ResourceFiles.Config = &(vcProject.Configuration);
}